

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O0

lzma_ret block_decode(lzma_coder_conflict11 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  anon_enum_32_conflict1 aVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  lzma_bool lVar5;
  lzma_ret lVar6;
  uint32_t uVar7;
  int iVar8;
  lzma_vli add;
  ulong out_size_00;
  size_t check_size;
  size_t out_used;
  size_t in_used;
  lzma_ret ret;
  size_t out_start;
  size_t in_start;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict11 *coder_local;
  
  aVar1 = coder->sequence;
  if (aVar1 == SEQ_CODE) {
    sVar3 = *in_pos;
    sVar2 = *out_pos;
    lVar6 = (*(coder->next).code)
                      ((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    add = *out_pos - sVar2;
    _Var4 = update_size(&coder->compressed_size,*in_pos - sVar3,coder->compressed_limit);
    if ((_Var4) ||
       (_Var4 = update_size(&coder->uncompressed_size,add,coder->block->uncompressed_size), _Var4))
    {
      return LZMA_DATA_ERROR;
    }
    lzma_check_update(&coder->check,coder->block->check,out + sVar2,add);
    if (lVar6 != LZMA_STREAM_END) {
      return lVar6;
    }
    _Var4 = is_size_valid(coder->compressed_size,coder->block->compressed_size);
    if ((!_Var4) ||
       (_Var4 = is_size_valid(coder->uncompressed_size,coder->block->uncompressed_size), !_Var4)) {
      return LZMA_DATA_ERROR;
    }
    coder->block->compressed_size = coder->compressed_size;
    coder->block->uncompressed_size = coder->uncompressed_size;
    coder->sequence = SEQ_PADDING;
  }
  else if (aVar1 != SEQ_PADDING) {
    if (aVar1 != SEQ_CHECK) {
      return LZMA_PROG_ERROR;
    }
    goto LAB_00224fe4;
  }
  while ((coder->compressed_size & 3) != 0) {
    if (in_size <= *in_pos) {
      return LZMA_OK;
    }
    coder->compressed_size = coder->compressed_size + 1;
    sVar3 = *in_pos;
    *in_pos = sVar3 + 1;
    if (in[sVar3] != '\0') {
      return LZMA_DATA_ERROR;
    }
  }
  if (coder->block->check == LZMA_CHECK_NONE) {
    return LZMA_STREAM_END;
  }
  lzma_check_finish(&coder->check,coder->block->check);
  coder->sequence = SEQ_CHECK;
LAB_00224fe4:
  uVar7 = lzma_check_size(coder->block->check);
  out_size_00 = (ulong)uVar7;
  lzma_bufcpy(in,in_pos,in_size,coder->block->raw_check,&coder->check_pos,out_size_00);
  if (coder->check_pos < out_size_00) {
    return LZMA_OK;
  }
  lVar5 = lzma_check_is_supported(coder->block->check);
  if ((lVar5 != '\0') &&
     (iVar8 = memcmp(coder->block->raw_check,&coder->check,out_size_00), iVar8 != 0)) {
    return LZMA_DATA_ERROR;
  }
  return LZMA_STREAM_END;
}

Assistant:

static lzma_ret
block_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		// NOTE: We compare to compressed_limit here, which prevents
		// the total size of the Block growing past LZMA_VLI_MAX.
		if (update_size(&coder->compressed_size, in_used,
					coder->compressed_limit)
				|| update_size(&coder->uncompressed_size,
					out_used,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		lzma_check_update(&coder->check, coder->block->check,
				out + out_start, out_used);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Compressed and Uncompressed Sizes are now at their final
		// values. Verify that they match the values given to us.
		if (!is_size_valid(coder->compressed_size,
					coder->block->compressed_size)
				|| !is_size_valid(coder->uncompressed_size,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Compressed Data is padded to a multiple of four bytes.
		while (coder->compressed_size & 3) {
			if (*in_pos >= in_size)
				return LZMA_OK;

			// We use compressed_size here just get the Padding
			// right. The actual Compressed Size was stored to
			// coder->block already, and won't be modified by
			// us anymore.
			++coder->compressed_size;

			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		lzma_check_finish(&coder->check, coder->block->check);
		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(in, in_pos, in_size, coder->block->raw_check,
				&coder->check_pos, check_size);
		if (coder->check_pos < check_size)
			return LZMA_OK;

		// Validate the Check only if we support it.
		// coder->check.buffer may be uninitialized
		// when the Check ID is not supported.
		if (lzma_check_is_supported(coder->block->check)
				&& memcmp(coder->block->raw_check,
					coder->check.buffer.u8,
					check_size) != 0)
			return LZMA_DATA_ERROR;

		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}